

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

int para_compute(int ele1,int ele2)

{
  int iVar1;
  ulong uVar2;
  undefined *puVar3;
  
  iVar1 = -1;
  switch(ele1) {
  case 0:
    if (3 < ele2 - 2U) {
      return -1;
    }
    uVar2 = (ulong)(ele2 - 2U);
    puVar3 = &DAT_003cc250;
    break;
  case 1:
    if (3 < ele2 - 2U) {
      return -1;
    }
    uVar2 = (ulong)(ele2 - 2U);
    puVar3 = &DAT_003cc260;
    break;
  case 2:
    if (5 < (uint)ele2) {
      return -1;
    }
    uVar2 = (ulong)(uint)ele2;
    puVar3 = &DAT_003cc174;
    break;
  case 3:
    if (5 < (uint)ele2) {
      return -1;
    }
    uVar2 = (ulong)(uint)ele2;
    puVar3 = &DAT_003cc18c;
    break;
  case 4:
    if (3 < (uint)ele2) {
      return -1;
    }
    uVar2 = (ulong)(uint)ele2;
    puVar3 = &DAT_003cc270;
    break;
  case 5:
    if (3 < (uint)ele2) {
      return -1;
    }
    uVar2 = (ulong)(uint)ele2;
    puVar3 = &DAT_003cc280;
    break;
  default:
    goto switchD_0030dd82_default;
  }
  iVar1 = *(int *)(puVar3 + uVar2 * 4);
switchD_0030dd82_default:
  return iVar1;
}

Assistant:

int para_compute(int ele1, int ele2)
{
	switch (ele1)
	{
		case ELE_HEAT:
			switch (ele2)
			{
				case ELE_AIR:			return ELE_SMOKE;
				case ELE_EARTH:			return ELE_MAGMA;
				case ELE_WATER:			return ELE_ACID;
				case ELE_ELECTRICITY:	return ELE_PLASMA;
				default:				break;
			}

			break;
		case ELE_COLD:
			switch (ele2)
			{
				case ELE_AIR:			return ELE_BLIZZARD;
				case ELE_EARTH:			return ELE_FROST;
				case ELE_WATER:			return ELE_ICE;
				case ELE_ELECTRICITY:	return ELE_CRYSTAL;
				default:				break;
			}

			break;
		case ELE_AIR:
			switch (ele2)
			{	
				case ELE_HEAT:			return ELE_SMOKE;
				case ELE_COLD:			return ELE_BLIZZARD;
				case ELE_WATER:			return ELE_MIST;
				case ELE_ELECTRICITY:	return ELE_LIGHTNING;
				default:				break;
			}

			break;
		case ELE_EARTH:
			switch (ele2)
			{	
				case ELE_HEAT:			return ELE_MAGMA;
				case ELE_COLD:			return ELE_FROST;
				case ELE_WATER:			return ELE_OOZE;
				case ELE_ELECTRICITY:	return ELE_METAL;
				default:				break;
			}

			break;
		case ELE_WATER:
			switch (ele2)
			{
				case ELE_HEAT:			return ELE_ACID;
				case ELE_COLD:			return ELE_ICE;
				case ELE_AIR:			return ELE_MIST;
				case ELE_EARTH:			return ELE_OOZE;
				default:				break;
			}

			break;
		case ELE_ELECTRICITY:
			switch (ele2)
			{
				case ELE_HEAT:			return ELE_PLASMA;
				case ELE_COLD:			return ELE_CRYSTAL;
				case ELE_AIR:			return ELE_LIGHTNING;
				case ELE_EARTH:			return ELE_METAL;
				default:				break;
			}

			break;
		default:
			break;
	}

	return -1;
}